

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_cci(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim;
  size_t sVar2;
  long lVar3;
  
  if (2 < g_debug) {
    act_cci_cold_1();
  }
  if (opts->prefix == (char *)0x0) {
    act_cci_cold_5();
  }
  else {
    if ((opts->infiles).len < 2) {
      nim = nt_image_read(opts,*(opts->infiles).list,0);
      if (nim == (nifti_image *)0x0) {
        return 1;
      }
      nim->data = (void *)0x0;
      iVar1 = nifti_read_collapsed_image(nim,opts->ci_dims,&nim->data);
      if (-1 < iVar1) {
        if (opts->keep_hist != 0) {
          sVar2 = strlen(opts->command);
          iVar1 = nifti_add_extension(nim,opts->command,(int)sVar2,6);
          if (iVar1 != 0) {
            act_cci_cold_2();
          }
        }
        iVar1 = nifti_set_filenames(nim,opts->prefix,1,1);
        if (iVar1 == 0) {
          lVar3 = 0;
          do {
            if (-1 < opts->ci_dims[lVar3 + 1]) {
              nim->dim[lVar3 + 1] = 1;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 7);
          nifti_update_dims_from_array(nim);
          if (2 < g_debug) {
            disp_field("new nim:\n",g_nim_fields,nim,0x3f,1);
          }
          iVar1 = nifti_nim_is_valid(nim,g_debug);
          if (iVar1 != 0) {
            nifti_image_write(nim);
          }
          nifti_image_free(nim);
          return 0;
        }
        act_cci_cold_3();
        return 1;
      }
      nifti_image_free(nim);
      return 1;
    }
    act_cci_cold_4();
  }
  return 1;
}

Assistant:

int act_cci( nt_opts * opts )
{
   nifti_image      * nim;
   int                c;

   if( g_debug > 2 )
      fprintf(stderr,"-d collapsing file info from '%s' to '%s'\n",
              opts->infiles.list[0], opts->prefix);

   /* sanity checks */
   if( ! opts->prefix ) {
      fprintf(stderr,"** error: -prefix is required with -cci function\n");
      return 1;
   } else if( opts->infiles.len > 1 ) {
      fprintf(stderr,"** sorry, at the moment -cci allows only 1 input\n");
      return 1;
   }

   nim = nt_image_read(opts, opts->infiles.list[0], 0);
   if( !nim ) return 1;
   nim->data = NULL;    /* just to be sure */

   if( nifti_read_collapsed_image(nim, opts->ci_dims, &nim->data) < 0 )
   {
      nifti_image_free(nim);
      return 1;
   }

   /* add command as COMMENT extension */
   if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                          strlen(opts->command), NIFTI_ECODE_COMMENT) )
      fprintf(stderr,"** failed to add command to image as extension\n");

   /* replace filenames using prefix */
   if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
   {
      fprintf(stderr,"** failed to set names, prefix = '%s'\n",opts->prefix);
      nifti_image_free(nim);
      return 1;
   }

   for( c = 1; c < 8; c++ )  /* nuke any collapsed dimension */
      if( opts->ci_dims[c] >= 0 ) nim->dim[c] = 1;

   nifti_update_dims_from_array(nim);

   if(g_debug>2) disp_field("new nim:\n",g_nim_fields,nim,NT_NIM_NUM_FIELDS,1);

   /* and finally, write out results */
   if( nifti_nim_is_valid(nim, g_debug) ) nifti_image_write(nim);

   nifti_image_free(nim);

   return 0;
}